

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_rpc_sendstring_client.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  amqp_rpc_reply_t x_01;
  amqp_rpc_reply_t x_02;
  amqp_rpc_reply_t x_03;
  amqp_rpc_reply_t x_04;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 *puVar11;
  char *pcVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  amqp_frame_t frame;
  undefined8 uStackY_300;
  undefined1 *puStackY_2f8;
  undefined1 *puStackY_2f0;
  undefined1 auStackY_2e0 [8];
  undefined4 *puStackY_2d8;
  undefined8 uStackY_2c8;
  ulong uStackY_2c0;
  undefined8 uStackY_2b8;
  code *pcStackY_230;
  undefined4 local_1b8;
  undefined1 local_1b0 [16];
  long local_1a0;
  undefined1 local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined8 local_f0 [4];
  undefined8 local_d0 [4];
  undefined8 local_b0 [2];
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined8 local_90 [4];
  undefined8 local_70 [4];
  undefined8 local_50 [4];
  
  if (argc < 6) {
    pcStackY_230 = (code *)0x102a0b;
    main_cold_5();
    return 1;
  }
  pcVar12 = argv[1];
  pcStackY_230 = (code *)0x1024c6;
  iVar4 = atoi(argv[2]);
  pcVar1 = argv[3];
  pcVar2 = argv[4];
  pcVar3 = argv[5];
  pcStackY_230 = (code *)0x1024e8;
  pcVar6 = (char *)amqp_new_connection();
  pcStackY_230 = (code *)0x1024f3;
  lVar7 = amqp_tcp_socket_new(pcVar6);
  if (lVar7 == 0) {
    pcStackY_230 = (code *)0x102509;
    die("creating TCP socket");
  }
  pcStackY_230 = (code *)0x102516;
  iVar4 = amqp_socket_open(lVar7,pcVar12,iVar4);
  if (iVar4 != 0) {
    pcStackY_230 = (code *)0x102528;
    die("opening TCP socket");
  }
  pcStackY_230 = (code *)0x102567;
  amqp_login(local_50,pcVar6,"/",0,0x20000,0);
  pcStackY_230 = (code *)0x102585;
  x.reply.id = (int)local_50[1];
  x._0_8_ = local_50[0];
  x.reply._4_4_ = (int)((ulong)local_50[1] >> 0x20);
  x.reply.decoded._0_4_ = (int)local_50[2];
  x.reply.decoded._4_4_ = (int)((ulong)local_50[2] >> 0x20);
  x.library_error = (int)local_50[3];
  x._28_4_ = (int)((ulong)local_50[3] >> 0x20);
  die_on_amqp_error(x,"Logging in");
  pcStackY_230 = (code *)0x102592;
  amqp_channel_open(pcVar6,1);
  pcStackY_230 = (code *)0x1025a5;
  amqp_get_rpc_reply(local_70,pcVar6);
  pcStackY_230 = (code *)0x1025c3;
  x_00.reply.id = (int)local_70[1];
  x_00._0_8_ = local_70[0];
  x_00.reply._4_4_ = (int)((ulong)local_70[1] >> 0x20);
  x_00.reply.decoded._0_4_ = (int)local_70[2];
  x_00.reply.decoded._4_4_ = (int)((ulong)local_70[2] >> 0x20);
  x_00.library_error = (int)local_70[3];
  x_00._28_4_ = (int)((ulong)local_70[3] >> 0x20);
  die_on_amqp_error(x_00,"Opening channel");
  uVar14 = _amqp_socket_open;
  uVar10 = _amqp_empty_bytes;
  pcStackY_230 = (code *)0x102605;
  puVar8 = (undefined8 *)amqp_queue_declare(pcVar6,1,_amqp_empty_bytes,_amqp_socket_open,0,0);
  pcStackY_230 = (code *)0x10261b;
  amqp_get_rpc_reply(local_90,pcVar6);
  pcStackY_230 = (code *)0x10263b;
  x_01.reply.id = (int)local_90[1];
  x_01._0_8_ = local_90[0];
  x_01.reply._4_4_ = (int)((ulong)local_90[1] >> 0x20);
  x_01.reply.decoded._0_4_ = (int)local_90[2];
  x_01.reply.decoded._4_4_ = (int)((ulong)local_90[2] >> 0x20);
  x_01.library_error = (int)local_90[3];
  x_01._28_4_ = (int)((ulong)local_90[3] >> 0x20);
  die_on_amqp_error(x_01,"Declaring queue");
  pcStackY_230 = (code *)0x102647;
  auVar16 = amqp_bytes_malloc_dup(*puVar8,puVar8[1]);
  lVar7 = auVar16._8_8_;
  uVar9 = auVar16._0_8_;
  if (lVar7 == 0) {
    pcStackY_230 = (code *)0x102a1b;
    main_cold_1();
  }
  if (lVar7 == 0) {
    return (uint)(lVar7 == 0);
  }
  local_1b8 = 0x9600;
  pcStackY_230 = (code *)0x10267d;
  local_1b0 = amqp_cstring_bytes("text/plain");
  local_180 = 2;
  pcStackY_230 = (code *)0x10269d;
  local_168 = amqp_bytes_malloc_dup(uVar9,lVar7);
  if (local_168._8_8_ == 0) {
    pcStackY_230 = (code *)0x102a2b;
    main_cold_2();
    return 1;
  }
  pcStackY_230 = (code *)0x1026c5;
  local_178 = amqp_cstring_bytes("1");
  pcStackY_230 = (code *)0x1026e1;
  auVar16 = amqp_cstring_bytes(pcVar1);
  pcStackY_230 = (code *)0x1026f5;
  auVar17 = amqp_cstring_bytes(pcVar2);
  pcStackY_230 = (code *)0x102708;
  amqp_cstring_bytes(pcVar3);
  pcStackY_230 = (code *)0x10274f;
  iVar4 = amqp_basic_publish(pcVar6,1,auVar16._0_8_,auVar16._8_8_,auVar17._0_8_,auVar17._8_8_);
  pcStackY_230 = (code *)0x10275d;
  die_on_error(iVar4,"Publishing");
  pcStackY_230 = (code *)0x102774;
  amqp_bytes_free(local_168._0_8_,local_168._8_8_);
  pcStackY_230 = (code *)0x1027ba;
  amqp_basic_consume(pcVar6,1,uVar9,lVar7,uVar10,uVar14);
  pcStackY_230 = (code *)0x1027cd;
  amqp_get_rpc_reply(local_b0,pcVar6);
  pcStackY_230 = (code *)0x1027eb;
  x_02.reply.id = (int)local_b0[1];
  x_02._0_8_ = local_b0[0];
  x_02.reply._4_4_ = (int)((ulong)local_b0[1] >> 0x20);
  x_02.reply.decoded._0_4_ = local_a0;
  x_02.reply.decoded._4_4_ = uStack_9c;
  x_02.library_error = uStack_98;
  x_02._28_4_ = uStack_94;
  die_on_amqp_error(x_02,"Consuming");
  pcStackY_230 = (code *)0x1027f6;
  amqp_bytes_free(uVar9,lVar7);
  pcStackY_230 = (code *)0x1027fe;
  amqp_maybe_release_buffers(pcVar6);
  pcStackY_230 = (code *)0x10280b;
  uVar5 = amqp_simple_wait_frame(pcVar6,&local_1b8);
  pcStackY_230 = (code *)0x10281d;
  printf("Result: %d\n",(ulong)uVar5);
  if (-1 < (int)uVar5) {
    do {
      pcStackY_230 = (code *)0x10284f;
      printf("Frame type: %d channel: %d\n",(ulong)(byte)local_1b8,(ulong)local_1b8._2_2_);
      if ((byte)local_1b8 == '\x01') {
        pcStackY_230 = (code *)0x10285f;
        uVar10 = amqp_method_name(local_1b0._0_8_ & 0xffffffff);
        pcStackY_230 = (code *)0x10286c;
        printf("Method: %s\n",uVar10);
        if (local_1b0._0_4_ == 0x3c003c) {
          puVar11 = &local_1b8;
          uVar10 = *(undefined8 *)(local_1b0._8_8_ + 0x28);
          uVar13 = (ulong)*(uint *)(local_1b0._8_8_ + 0x30);
          uVar14 = *(undefined8 *)(local_1b0._8_8_ + 0x38);
          pcStackY_230 = (code *)0x102967;
          printf("Delivery: %u exchange: %.*s routingkey: %.*s\n",
                 (ulong)*(uint *)(local_1b0._8_8_ + 0x10),(ulong)*(uint *)(local_1b0._8_8_ + 0x20));
          pcStackY_230 = (code *)0x102972;
          pcVar12 = pcVar6;
          iVar4 = amqp_simple_wait_frame();
          if (-1 < iVar4) {
            if ((byte)local_1b8 != '\x02') goto LAB_00102a3b;
            if ((*(byte *)(local_1a0 + 1) & 0x80) != 0) {
              pcStackY_230 = (code *)0x1029a8;
              printf("Content-type: %.*s\n",(ulong)*(uint *)(local_1a0 + 8),
                     *(undefined8 *)(local_1a0 + 0x10));
            }
            pcStackY_230 = (code *)0x1029b4;
            puts("----");
            uVar9 = local_1b0._8_8_;
            if (local_1b0._8_8_ != 0) {
              uVar15 = 0;
              goto LAB_001029cd;
            }
          }
          break;
        }
      }
      pcStackY_230 = (code *)0x102882;
      amqp_maybe_release_buffers(pcVar6);
      pcStackY_230 = (code *)0x10288d;
      uVar5 = amqp_simple_wait_frame(pcVar6,&local_1b8);
      pcStackY_230 = (code *)0x10289b;
      printf("Result: %d\n",(ulong)uVar5);
    } while (-1 < (int)uVar5);
  }
  goto LAB_0010289f;
LAB_001029cd:
  do {
    pcStackY_230 = (code *)0x1029d8;
    puVar11 = &local_1b8;
    pcVar12 = pcVar6;
    iVar4 = amqp_simple_wait_frame();
    if (iVar4 < 0) break;
    if ((byte)local_1b8 != '\x03') {
      pcStackY_230 = (code *)0x102a3b;
      main_cold_4();
LAB_00102a3b:
      pcStackY_230 = die;
      main_cold_3();
      puStackY_2f0 = auStackY_2e0;
      puStackY_2f8 = &stack0xfffffffffffffde0;
      uStackY_300 = 0x3000000008;
      puStackY_2d8 = puVar11;
      uStackY_2c8 = uVar10;
      uStackY_2c0 = uVar13;
      uStackY_2b8 = uVar14;
      pcStackY_230 = (code *)pcVar6;
      vfprintf(_stderr,pcVar12,&uStackY_300);
      fputc(10,_stderr);
      exit(1);
    }
    uVar15 = uVar15 + local_1b0._0_8_;
    pcStackY_230 = (code *)0x1029fc;
    amqp_dump((void *)local_1b0._8_8_,local_1b0._0_8_);
  } while (uVar15 < (ulong)uVar9);
LAB_0010289f:
  pcStackY_230 = (code *)0x1028bc;
  amqp_channel_close(local_d0,pcVar6,1,200);
  pcStackY_230 = (code *)0x1028da;
  x_03.reply.id = (int)local_d0[1];
  x_03._0_8_ = local_d0[0];
  x_03.reply._4_4_ = (int)((ulong)local_d0[1] >> 0x20);
  x_03.reply.decoded._0_4_ = (int)local_d0[2];
  x_03.reply.decoded._4_4_ = (int)((ulong)local_d0[2] >> 0x20);
  x_03.library_error = (int)local_d0[3];
  x_03._28_4_ = (int)((ulong)local_d0[3] >> 0x20);
  die_on_amqp_error(x_03,"Closing channel");
  pcStackY_230 = (code *)0x1028f2;
  amqp_connection_close(local_f0,pcVar6,200);
  pcStackY_230 = (code *)0x102910;
  x_04.reply.id = (int)local_f0[1];
  x_04._0_8_ = local_f0[0];
  x_04.reply._4_4_ = (int)((ulong)local_f0[1] >> 0x20);
  x_04.reply.decoded._0_4_ = (int)local_f0[2];
  x_04.reply.decoded._4_4_ = (int)((ulong)local_f0[2] >> 0x20);
  x_04.library_error = (int)local_f0[3];
  x_04._28_4_ = (int)((ulong)local_f0[3] >> 0x20);
  die_on_amqp_error(x_04,"Closing connection");
  pcStackY_230 = (code *)0x102918;
  iVar4 = amqp_destroy_connection(pcVar6);
  pcStackY_230 = (code *)0x102926;
  die_on_error(iVar4,"Ending connection");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  char const *hostname;
  int port, status;
  char const *exchange;
  char const *routingkey;
  char const *messagebody;
  amqp_socket_t *socket = NULL;
  amqp_connection_state_t conn;
  amqp_bytes_t reply_to_queue;

  if (argc < 6) { /* minimum number of mandatory arguments */
    fprintf(stderr, "usage:\namqp_rpc_sendstring_client host port exchange routingkey messagebody\n");
    return 1;
  }

  hostname = argv[1];
  port = atoi(argv[2]);
  exchange = argv[3];
  routingkey = argv[4];
  messagebody = argv[5];

  /*
     establish a channel that is used to connect RabbitMQ server
  */

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);
  if (!socket) {
    die("creating TCP socket");
  }

  status = amqp_socket_open(socket, hostname, port);
  if (status) {
    die("opening TCP socket");
  }

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"),
                    "Logging in");
  amqp_channel_open(conn, 1);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Opening channel");

  /*
     create private reply_to queue
  */

  {
    amqp_queue_declare_ok_t *r = amqp_queue_declare(conn, 1, amqp_empty_bytes, 0, 0, 0, 1, amqp_empty_table);
    die_on_amqp_error(amqp_get_rpc_reply(conn), "Declaring queue");
    reply_to_queue = amqp_bytes_malloc_dup(r->queue);
    if (reply_to_queue.bytes == NULL) {
      fprintf(stderr, "Out of memory while copying queue name");
      return 1;
    }
  }

  /*
     send the message
  */

  {
    /*
      set properties
    */
    amqp_basic_properties_t props;
    props._flags = AMQP_BASIC_CONTENT_TYPE_FLAG |
                   AMQP_BASIC_DELIVERY_MODE_FLAG |
                   AMQP_BASIC_REPLY_TO_FLAG |
                   AMQP_BASIC_CORRELATION_ID_FLAG;
    props.content_type = amqp_cstring_bytes("text/plain");
    props.delivery_mode = 2; /* persistent delivery mode */
    props.reply_to = amqp_bytes_malloc_dup(reply_to_queue);
    if (props.reply_to.bytes == NULL) {
      fprintf(stderr, "Out of memory while copying queue name");
      return 1;
    }
    props.correlation_id = amqp_cstring_bytes("1");

    /*
      publish
    */
    die_on_error(amqp_basic_publish(conn,
                                    1,
                                    amqp_cstring_bytes(exchange),
                                    amqp_cstring_bytes(routingkey),
                                    0,
                                    0,
                                    &props,
                                    amqp_cstring_bytes(messagebody)),
                 "Publishing");

    amqp_bytes_free(props.reply_to);
  }

  /*
    wait an answer
  */

  {
    amqp_basic_consume(conn, 1, reply_to_queue, amqp_empty_bytes, 0, 1, 0, amqp_empty_table);
    die_on_amqp_error(amqp_get_rpc_reply(conn), "Consuming");
    amqp_bytes_free(reply_to_queue);

    {
      amqp_frame_t frame;
      int result;

      amqp_basic_deliver_t *d;
      amqp_basic_properties_t *p;
      size_t body_target;
      size_t body_received;

      while (1) {
        amqp_maybe_release_buffers(conn);
        result = amqp_simple_wait_frame(conn, &frame);
        printf("Result: %d\n", result);
        if (result < 0) {
          break;
        }

        printf("Frame type: %d channel: %d\n", frame.frame_type, frame.channel);
        if (frame.frame_type != AMQP_FRAME_METHOD) {
          continue;
        }

        printf("Method: %s\n", amqp_method_name(frame.payload.method.id));
        if (frame.payload.method.id != AMQP_BASIC_DELIVER_METHOD) {
          continue;
        }

        d = (amqp_basic_deliver_t *) frame.payload.method.decoded;
        printf("Delivery: %u exchange: %.*s routingkey: %.*s\n",
               (unsigned) d->delivery_tag,
               (int) d->exchange.len, (char *) d->exchange.bytes,
               (int) d->routing_key.len, (char *) d->routing_key.bytes);

        result = amqp_simple_wait_frame(conn, &frame);
        if (result < 0) {
          break;
        }

        if (frame.frame_type != AMQP_FRAME_HEADER) {
          fprintf(stderr, "Expected header!");
          abort();
        }
        p = (amqp_basic_properties_t *) frame.payload.properties.decoded;
        if (p->_flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
          printf("Content-type: %.*s\n",
                 (int) p->content_type.len, (char *) p->content_type.bytes);
        }
        printf("----\n");

        body_target = frame.payload.properties.body_size;
        body_received = 0;

        while (body_received < body_target) {
          result = amqp_simple_wait_frame(conn, &frame);
          if (result < 0) {
            break;
          }

          if (frame.frame_type != AMQP_FRAME_BODY) {
            fprintf(stderr, "Expected body!");
            abort();
          }

          body_received += frame.payload.body_fragment.len;
          assert(body_received <= body_target);

          amqp_dump(frame.payload.body_fragment.bytes,
                    frame.payload.body_fragment.len);
        }

        if (body_received != body_target) {
          /* Can only happen when amqp_simple_wait_frame returns <= 0 */
          /* We break here to close the connection */
          break;
        }

        /* everything was fine, we can quit now because we received the reply */
        break;
      }

    }
  }

  /*
     closing
  */

  die_on_amqp_error(amqp_channel_close(conn, 1, AMQP_REPLY_SUCCESS), "Closing channel");
  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");

  return 0;
}